

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::OuterEdgeVertexSetIndexIndependenceCase::iterate
          (OuterEdgeVertexSetIndexIndependenceCase *this)

{
  float fVar1;
  TessPrimitiveType TVar2;
  RenderContext *pRVar3;
  void *pvVar4;
  _func_int **pp_Var5;
  pointer pfVar6;
  pointer pfVar7;
  float *pfVar8;
  bool bVar9;
  int iVar10;
  deUint32 dVar11;
  int iVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Rb_tree_node_base *p_Var13;
  char *pcVar14;
  TestLog *pTVar15;
  size_t sVar16;
  float fVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  _Rb_tree_node_base *p_Var21;
  float fVar22;
  float *__result;
  float *pfVar23;
  _Rb_tree_node_base *p_Var24;
  ulong uVar25;
  pointer pOVar26;
  ulong uVar27;
  _Rb_tree_const_iterator<tcu::Vector<float,_3>_> __last1;
  int numIndentationSpaces;
  Functional *outerLevels;
  pointer pOVar28;
  char *__s;
  ulong uVar29;
  uint uVar30;
  bool bVar31;
  undefined8 uVar32;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar33;
  Vec3Set currentEdgeVertices;
  vector<float,_std::allocator<float>_> patchTessLevels_1;
  vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
  edgeDescriptions;
  VertexArrayBinding bindings [1];
  Result tfResult;
  RandomViewport viewport;
  Vec3Set firstEdgeVertices;
  vector<float,_std::allocator<float>_> patchTessLevels;
  TFHandler tfHandler;
  Random rnd;
  undefined1 local_580 [32];
  _Base_ptr local_560;
  size_t local_558;
  long local_550;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_548;
  vector<float,_std::allocator<float>_> local_540;
  deUint32 local_524;
  float local_520;
  float local_51c;
  vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
  local_518;
  long local_500;
  undefined1 local_4f8 [8];
  _Alloc_hider local_4f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e0;
  int local_4d0;
  VertexArrayPointer local_4c8;
  Result local_4a8;
  RandomViewport local_488;
  set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
  local_478;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  double local_388;
  undefined1 local_380 [4];
  float fStack_37c;
  undefined1 local_378 [16];
  _func_int *local_368 [2];
  int local_358;
  ios_base local_308 [264];
  TransformFeedbackHandler<tcu::Vector<float,_3>_> local_200;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  
  local_548 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar10 = (*pRVar3->_vptr_RenderContext[4])(pRVar3);
  dVar11 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p
                       );
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_488,(RenderTarget *)CONCAT44(extraout_var,iVar10),0x10,0x10,dVar11);
  iVar10 = (*pRVar3->_vptr_RenderContext[3])(pRVar3);
  lVar18 = CONCAT44(extraout_var_00,iVar10);
  dVar11 = (((this->m_program).m_ptr)->m_program).m_program;
  outerEdgeDescriptions(&local_518,this->m_primitiveType);
  local_524 = dVar11;
  (**(code **)(lVar18 + 0x1680))(dVar11);
  (**(code **)(lVar18 + 0x1a00))(local_488.x,local_488.y,local_488.width,local_488.height);
  (**(code **)(lVar18 + 0xfd8))(0x8e72,6);
  fVar22 = 1.0;
  lVar18 = 4;
  pfVar23 = iterate::singleOuterEdgeLevels;
  do {
    fVar17 = *(float *)((long)iterate::singleOuterEdgeLevels + lVar18);
    pfVar8 = (float *)((long)iterate::singleOuterEdgeLevels + lVar18);
    if (*(float *)((long)iterate::singleOuterEdgeLevels + lVar18) <= fVar22) {
      fVar17 = fVar22;
      pfVar8 = pfVar23;
    }
    pfVar23 = pfVar8;
    fVar22 = fVar17;
    lVar18 = lVar18 + 4;
  } while (lVar18 != 0x30);
  fVar22 = *pfVar23;
  deRandom_init((deRandom *)local_1b0,0x7b);
  generateRandomPatchTessLevels
            ((vector<float,_std::allocator<float>_> *)local_380,1,0,fVar22,(Random *)local_1b0);
  TVar2 = this->m_primitiveType;
  bVar31 = this->m_usePointMode;
  iVar12 = referencePrimitiveCount
                     (TVar2,this->m_spacing,bVar31,(float *)CONCAT44(fStack_37c,local_380),
                      (float *)CONCAT44(fStack_37c,local_380) + 2);
  iVar10 = 1;
  if ((bVar31 == false) && (iVar10 = -1, TVar2 < TESSPRIMITIVETYPE_LAST)) {
    iVar10 = *(int *)(&DAT_01c43520 + (ulong)TVar2 * 4);
  }
  pvVar4 = (void *)CONCAT44(fStack_37c,local_380);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,local_378._8_8_ - (long)pvVar4);
  }
  __last1._M_node = (_Base_ptr)((this->super_TestCase).m_context)->m_renderCtx;
  TransformFeedbackHandler<tcu::Vector<float,_3>_>::TransformFeedbackHandler
            (&local_200,(RenderContext *)__last1._M_node,iVar10 * iVar12);
  local_550 = 0;
  pOVar26 = local_518.
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pOVar28 = local_518.
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    local_478._M_t._M_impl._0_1_ = (Functional)0x0;
    local_478._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_478._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_478._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_478._M_t._M_impl.super__Rb_tree_header._M_header;
    local_478._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_478._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_478._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (0 < (int)((ulong)((long)pOVar26 - (long)pOVar28) >> 4)) {
      local_520 = iterate::singleOuterEdgeLevels[local_550];
      local_388 = (double)local_520;
      local_500 = 8;
      uVar29 = 0;
      do {
        deRandom_init((deRandom *)local_380,0x7b);
        fVar22 = (float)uVar29;
        generateRandomPatchTessLevels(&local_540,1,(int)fVar22,local_520,(Random *)local_380);
        local_1b0 = (undefined1  [8])local_1a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"in_v_attr","");
        pfVar7 = local_540.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pfVar6 = local_540.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_380 = (undefined1  [4])0x1;
        local_378._0_8_ = local_368;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_378,local_1b0,(pointer)((long)local_1a8 + (long)local_1b0));
        local_358 = 0;
        local_4f8._0_4_ = local_380;
        local_4f0._M_p = (pointer)&local_4e0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_4f0,local_378._0_8_,local_378._8_8_ + local_378._0_8_);
        local_4d0 = local_358;
        local_4c8.componentType = VTX_COMP_FLOAT;
        local_4c8.convert = VTX_COMP_CONVERT_NONE;
        local_4c8.numComponents = 1;
        local_4c8.numElements = (int)((ulong)((long)pfVar7 - (long)pfVar6) >> 2);
        local_4c8.stride = 0;
        local_4c8.data = pfVar6;
        if ((_func_int **)local_378._0_8_ != local_368) {
          operator_delete((void *)local_378._0_8_,(ulong)(local_368[0] + 1));
        }
        if (local_1b0 != (undefined1  [8])local_1a0) {
          operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
        }
        local_380 = SUB84(local_548,0);
        fStack_37c = (float)((ulong)local_548 >> 0x20);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_378);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_378,"Testing with outer tessellation level ",0x26);
        std::ostream::_M_insert<double>(local_388);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378," for the ",9);
        pOVar26 = pOVar28 + uVar29;
        Functional::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                  ((string *)local_1b0,pOVar26);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_378,(char *)local_1b0,(long)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_378," edge, and with various levels for other edges",0x2e);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_380,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if (local_1b0 != (undefined1  [8])local_1a0) {
          operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_378);
        std::ios_base::~ios_base(local_308);
        dVar11 = 0;
        if (this->m_usePointMode == false) {
          dVar11 = 0xffffffff;
          if ((ulong)this->m_primitiveType < 3) {
            dVar11 = *(deUint32 *)(&DAT_01c4352c + (ulong)this->m_primitiveType * 4);
          }
        }
        TransformFeedbackHandler<tcu::Vector<float,_3>_>::renderAndGetPrimitives
                  (&local_4a8,&local_200,local_524,dVar11,1,(VertexArrayBinding *)local_4f8,
                   (int)((ulong)((long)local_540.super__Vector_base<float,_std::allocator<float>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)local_540.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 2));
        TVar2 = this->m_primitiveType;
        bVar31 = this->m_usePointMode;
        outerLevels = (Functional *)
                      ((long)local_540.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start + 8);
        iVar12 = referencePrimitiveCount
                           (TVar2,this->m_spacing,bVar31,
                            local_540.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,(float *)outerLevels);
        lVar18 = local_500;
        numIndentationSpaces = (int)outerLevels;
        iVar10 = 1;
        if ((bVar31 == false) && (iVar10 = -1, TVar2 < TESSPRIMITIVETYPE_LAST)) {
          iVar10 = *(int *)(&DAT_01c43520 + (ulong)TVar2 * 4);
        }
        uVar30 = iVar10 * iVar12;
        if (uVar30 == (int)((ulong)((long)local_4a8.varying.
                                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_4a8.varying.
                                         super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                      -0x55555555) {
          local_580[0] = (Functional)0x0;
          local_580._8_4_ = _S_red;
          fVar17 = 0.0;
          local_580._16_8_ = (_Base_ptr)0x0;
          local_580._24_8_ = local_580 + 8;
          local_558 = 0;
          local_560 = (_Base_ptr)local_580._24_8_;
          if (0 < (int)uVar30) {
            uVar25 = 0;
            pp_Var5 = (_func_int **)local_378._0_8_;
            do {
              local_378._4_4_ = (undefined4)((ulong)pp_Var5 >> 0x20);
              fVar17 = (float)pOVar26->numConstantCoordinateValueChoices;
              uVar19 = (ulong)(int)fVar17;
              if (0 < (long)uVar19) {
                pfVar23 = local_4a8.varying.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar25].m_data;
                fVar1 = pfVar23[pOVar26->constantCoordinateIndex];
                if ((fVar1 != pOVar26->constantCoordinateValueChoices[0]) ||
                   (NAN(fVar1) || NAN(pOVar26->constantCoordinateValueChoices[0]))) {
                  uVar20 = 1;
                  do {
                    uVar27 = uVar20;
                    if (uVar19 == uVar27) break;
                    pfVar8 = (float *)((long)pOVar28->constantCoordinateValueChoices +
                                      uVar27 * 4 + lVar18 + -8);
                    uVar20 = uVar27 + 1;
                  } while ((fVar1 != *pfVar8) || (NAN(fVar1) || NAN(*pfVar8)));
                  if (uVar19 <= uVar27) goto LAB_01429fc8;
                }
                fVar17 = (float)this->m_primitiveType;
                if (fVar17 == 1.4013e-45) {
                  local_51c = -1.0;
                  if ((uint)fVar22 < 4) {
                    fVar17 = (float)((&switchD_01429e6f::switchdataD_01c4265c)[uVar29 & 0xffffffff]
                                    + 0x1c4265c);
                    switch(uVar29 & 0xffffffff) {
                    default:
                      pfVar23 = pfVar23 + 1;
                      break;
                    case 1:
                    case 3:
                      break;
                    }
                    local_51c = *pfVar23;
                  }
                  fStack_37c = 0.0;
                  local_378._0_4_ = 0.0;
                  local_380 = (undefined1  [4])local_51c;
                  pVar33 = std::
                           _Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                           ::_M_get_insert_unique_pos
                                     ((_Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                       *)local_580,(key_type *)local_380);
                  p_Var24 = pVar33.second;
                  pp_Var5 = (_func_int **)CONCAT44(local_378._4_4_,local_378._0_4_);
                  if (p_Var24 != (_Rb_tree_node_base *)0x0) {
                    bVar31 = true;
                    if (((_Rb_tree_node_base *)(local_580 + 8) != p_Var24 &&
                         pVar33.first == (_Rb_tree_node_base *)0x0) &&
                       ((float)p_Var24[1]._M_color <= local_51c)) {
                      if (local_51c <= (float)p_Var24[1]._M_color) {
                        uVar19 = 0;
                        do {
                          uVar20 = uVar19;
                          uVar19 = uVar20;
                          if (uVar20 == 2) goto LAB_01429f7c;
                          if ((&fStack_37c)[uVar20] < *(float *)(&p_Var24[1].field_0x4 + uVar20 * 4)
                             ) {
                            uVar19 = 1;
                            goto LAB_01429f7c;
                          }
                          uVar19 = uVar20 + 1;
                        } while ((&fStack_37c)[uVar20] <=
                                 *(float *)(&p_Var24[1].field_0x4 + uVar20 * 4));
                        uVar19 = 0;
LAB_01429f7c:
                        bVar31 = (bool)(uVar20 < 2 & (byte)uVar19);
                      }
                      else {
                        bVar31 = false;
                      }
                    }
                    p_Var13 = (_Rb_tree_node_base *)operator_new(0x30);
                    *(undefined4 *)&p_Var13[1]._M_parent = local_378._0_4_;
                    *(ulong *)(p_Var13 + 1) = CONCAT44(fStack_37c,local_380);
                    p_Var21 = (_Rb_tree_node_base *)(local_580 + 8);
                    std::_Rb_tree_insert_and_rebalance(bVar31,p_Var13,p_Var24,p_Var21);
                    fVar17 = SUB84(p_Var21,0);
                    local_558 = local_558 + 1;
                    pp_Var5 = (_func_int **)CONCAT44(local_378._4_4_,local_378._0_4_);
                  }
                }
                else if (fVar17 == 0.0) {
                  if (fVar22 == 0.0) {
                    fVar17 = pfVar23[2];
                    local_380 = SUB84(*(undefined8 *)pfVar23,0);
                    fStack_37c = (float)((ulong)*(undefined8 *)pfVar23 >> 0x20);
                    local_378._0_4_ = fVar17;
                  }
                  else {
                    fVar17 = fVar22;
                    if (fVar22 == 1.4013e-45) {
                      local_378._0_4_ = pfVar23[2];
                      uVar32 = *(undefined8 *)pfVar23;
                    }
                    else {
                      if (fVar22 != 2.8026e-45) {
                        local_380 = (undefined1  [4])0xbf800000;
                        fStack_37c = -1.0;
                        local_378._0_4_ = -1.0;
                        goto LAB_01429f3e;
                      }
                      local_378._0_4_ = *pfVar23;
                      uVar32 = *(undefined8 *)(pfVar23 + 1);
                    }
                    fStack_37c = (float)uVar32;
                    local_380 = SUB84((ulong)uVar32 >> 0x20,0);
                  }
LAB_01429f3e:
                  std::
                  set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                  ::insert((set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                            *)local_580,(key_type *)local_380);
                  pp_Var5 = (_func_int **)CONCAT44(local_378._4_4_,local_378._0_4_);
                }
              }
LAB_01429fc8:
              local_378._0_8_ = pp_Var5;
              numIndentationSpaces = (int)outerLevels;
              uVar25 = uVar25 + 1;
              pp_Var5 = (_func_int **)local_378._0_8_;
            } while (uVar25 != uVar30);
          }
          if (uVar29 == 0) {
            bVar31 = true;
            __last1._M_node = (_Base_ptr)local_580;
            std::
            set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
            ::operator=(&local_478,
                        (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                         *)__last1._M_node);
          }
          else {
            if (local_558 == local_478._M_t._M_impl.super__Rb_tree_header._M_node_count) {
              __last1._M_node = (_Base_ptr)(local_580 + 8);
              bVar9 = std::__equal<false>::
                      equal<std::_Rb_tree_const_iterator<tcu::Vector<float,3>>,std::_Rb_tree_const_iterator<tcu::Vector<float,3>>>
                                ((_Rb_tree_const_iterator<tcu::Vector<float,_3>_>)local_580._24_8_,
                                 __last1,(_Rb_tree_const_iterator<tcu::Vector<float,_3>_>)
                                         local_478._M_t._M_impl.super__Rb_tree_header._M_header.
                                         _M_left);
              bVar31 = true;
              if (bVar9) goto LAB_0142a5cc;
            }
            if (this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) {
              __s = "(x, 0)";
              if (fVar22 != 1.4013e-45) {
                if (fVar22 != 2.8026e-45) {
                  bVar31 = uVar29 == 3;
                  pcVar14 = "(x, 0)";
                  goto LAB_0142a22c;
                }
                __s = "(y, 0)";
              }
            }
            else if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
              __s = "(y, x, z)";
              if (uVar29 != 1) {
                bVar31 = uVar29 == 2;
                pcVar14 = "(z, y, x)";
LAB_0142a22c:
                __s = (char *)0x0;
                if (bVar31) {
                  __s = pcVar14;
                }
              }
            }
            else {
              __s = (char *)0x0;
            }
            local_1b0 = (undefined1  [8])local_548;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,"Failure: the set of vertices on the ",0x24);
            Functional::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                      (&local_3a8,pOVar26);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,local_3a8._M_dataplus._M_p,local_3a8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," edge",5);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8," doesn\'t match the set of vertices on the ",0x2a);
            pOVar28 = local_518.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            Functional::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                      (&local_3c8,
                       local_518.
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                       ._M_impl.super__Vector_impl_data._M_start);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,local_3c8._M_dataplus._M_p,local_3c8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," edge",5);
            pTVar15 = tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)local_1b0,
                                 (EndMessageToken *)&tcu::TestLog::EndMessage);
            local_380 = SUB84(pTVar15,0);
            fStack_37c = (float)((ulong)pTVar15 >> 0x20);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_378);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_378,"Note: set of vertices on ",0x19);
            Functional::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                      (&local_3e8,pOVar26);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_378,local_3e8._M_dataplus._M_p,local_3e8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_378," edge, components swizzled like ",0x20);
            if (__s == (char *)0x0) {
              std::ios::clear((int)local_378 + (int)*(_func_int **)(local_378._0_8_ + -0x18));
            }
            else {
              sVar16 = strlen(__s);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378,__s,sVar16);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_378," to match component order on first edge:\n",0x29);
            containerStr<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                      (&local_408,(Functional *)local_580,
                       (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        *)0x0,(int)fVar17,numIndentationSpaces);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_378,local_408._M_dataplus._M_p,local_408._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378,"\non ",4);
            Functional::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                      (&local_428,pOVar28);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_378,local_428._M_dataplus._M_p,local_428._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378," edge:\n",7);
            containerStr<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                      (&local_448,(Functional *)&local_478,
                       (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        *)0x0,(int)fVar17,numIndentationSpaces);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_378,local_448._M_dataplus._M_p,local_448._M_string_length);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_380,(EndMessageToken *)&tcu::TestLog::EndMessage);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_448._M_dataplus._M_p != &local_448.field_2) {
              operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_428._M_dataplus._M_p != &local_428.field_2) {
              operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_408._M_dataplus._M_p != &local_408.field_2) {
              operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
              operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_378);
            std::ios_base::~ios_base(local_308);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
              operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
              operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
            std::ios_base::~ios_base(local_138);
            __last1._M_node = (_Base_ptr)&DAT_00000001;
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_FAIL,"Invalid set of vertices");
            bVar31 = false;
          }
LAB_0142a5cc:
          std::
          _Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
          ::_M_erase((_Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      *)local_580._16_8_,(_Link_type)__last1._M_node);
        }
        else {
          local_1b0 = (undefined1  [8])local_548;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,
                     "Failure: the number of vertices returned by transform feedback is ",0x42);
          std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,", expected ",0xb);
          std::ostream::operator<<((ostringstream *)&local_1a8,uVar30);
          pTVar15 = tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_1b0,
                               (EndMessageToken *)&tcu::TestLog::EndMessage);
          local_380 = SUB84(pTVar15,0);
          fStack_37c = (float)((ulong)pTVar15 >> 0x20);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_378);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_378,
                     "Note: rendered 1 patch, tessellation levels are (in order [inner0, inner1, outer0, outer1, outer2, outer3]):\n"
                     ,0x6d);
          containerStr<std::vector<float,std::allocator<float>>>
                    ((string *)local_580,
                     (Functional *)
                     local_540.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (vector<float,_std::allocator<float>_> *)
                     local_540.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish,6,numIndentationSpaces);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_378,(char *)CONCAT71(local_580._1_7_,local_580[0]),
                     CONCAT44(local_580._12_4_,local_580._8_4_));
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_380,(EndMessageToken *)&tcu::TestLog::EndMessage);
          if ((undefined1 *)CONCAT71(local_580._1_7_,local_580[0]) != local_580 + 0x10) {
            operator_delete((undefined1 *)CONCAT71(local_580._1_7_,local_580[0]),
                            (ulong)(local_580._16_8_ + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_378);
          std::ios_base::~ios_base(local_308);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          std::ios_base::~ios_base(local_138);
          __last1._M_node = (_Base_ptr)&DAT_00000001;
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Invalid set of vertices");
          bVar31 = false;
        }
        if (local_4a8.varying.
            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          __last1._M_node =
               (_Base_ptr)
               ((long)local_4a8.varying.
                      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
               (long)local_4a8.varying.
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
          operator_delete(local_4a8.varying.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,(ulong)__last1._M_node);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f0._M_p != &local_4e0) {
          __last1._M_node = (_Base_ptr)(local_4e0._M_allocated_capacity + 1);
          operator_delete(local_4f0._M_p,(ulong)__last1._M_node);
        }
        if ((Functional *)
            local_540.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (Functional *)0x0) {
          __last1._M_node =
               (_Base_ptr)
               ((long)local_540.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage -
               (long)local_540.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start);
          operator_delete(local_540.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,(ulong)__last1._M_node);
        }
        if (!bVar31) {
          std::
          _Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
          ::_M_erase((_Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      *)local_478._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                     (_Link_type)__last1._M_node);
          glu::ObjectWrapper::~ObjectWrapper(&local_200.m_tfPrimQuery.super_ObjectWrapper);
          glu::ObjectWrapper::~ObjectWrapper(&local_200.m_tfBuffer.super_ObjectWrapper);
          glu::ObjectWrapper::~ObjectWrapper(&local_200.m_tf.super_ObjectWrapper);
          goto LAB_0142a719;
        }
        uVar29 = uVar29 + 1;
        local_500 = local_500 + 0x10;
        pOVar26 = local_518.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pOVar28 = local_518.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while ((long)uVar29 <
               (long)(int)((ulong)((long)local_518.
                                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_518.
                                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4));
    }
    std::
    _Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
    ::_M_erase((_Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                *)local_478._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
               (_Link_type)__last1._M_node);
    local_550 = local_550 + 1;
    if (local_550 == 0xc) {
      glu::ObjectWrapper::~ObjectWrapper(&local_200.m_tfPrimQuery.super_ObjectWrapper);
      glu::ObjectWrapper::~ObjectWrapper(&local_200.m_tfBuffer.super_ObjectWrapper);
      glu::ObjectWrapper::~ObjectWrapper(&local_200.m_tf.super_ObjectWrapper);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      local_518.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
      ._M_impl.super__Vector_impl_data._M_start = pOVar28;
LAB_0142a719:
      if (local_518.
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_518.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_518.
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_518.
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return STOP;
    }
  } while( true );
}

Assistant:

OuterEdgeVertexSetIndexIndependenceCase::IterateResult OuterEdgeVertexSetIndexIndependenceCase::iterate (void)
{
	typedef TransformFeedbackHandler<Vec3> TFHandler;

	TestLog&							log							= m_testCtx.getLog();
	const RenderContext&				renderCtx					= m_context.getRenderContext();
	const RandomViewport				viewport					(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const glw::Functions&				gl							= renderCtx.getFunctions();
	const deUint32						programGL					= m_program->getProgram();

	static const float					singleOuterEdgeLevels[]		= { 1.0f, 1.2f, 1.9f, 2.3f, 2.8f, 3.3f, 3.8f, 10.2f, 1.6f, 24.4f, 24.7f, 63.0f };
	const vector<OuterEdgeDescription>	edgeDescriptions			= outerEdgeDescriptions(m_primitiveType);

	gl.useProgram(programGL);
	setViewport(gl, viewport);
	gl.patchParameteri(GL_PATCH_VERTICES, 6);

	{
		// Compute the number vertices in the largest draw call, so we can allocate the TF buffer just once.
		int maxNumVerticesInDrawCall = 0;
		{
			const vector<float> patchTessLevels = generatePatchTessLevels(1, 0 /* outer-edge index doesn't affect vertex count */, arrayMax(singleOuterEdgeLevels));
			maxNumVerticesInDrawCall = referenceVertexCount(m_primitiveType, m_spacing, m_usePointMode, &patchTessLevels[0], &patchTessLevels[2]);
		}

		{
			const TFHandler tfHandler(m_context.getRenderContext(), maxNumVerticesInDrawCall);

			for (int outerEdgeLevelCaseNdx = 0; outerEdgeLevelCaseNdx < DE_LENGTH_OF_ARRAY(singleOuterEdgeLevels); outerEdgeLevelCaseNdx++)
			{
				typedef std::set<Vec3, VecLexLessThan<3> > Vec3Set;

				Vec3Set firstEdgeVertices;

				for (int outerEdgeIndex = 0; outerEdgeIndex < (int)edgeDescriptions.size(); outerEdgeIndex++)
				{
					const OuterEdgeDescription&		edgeDesc			= edgeDescriptions[outerEdgeIndex];
					const vector<float>				patchTessLevels		= generatePatchTessLevels(1, outerEdgeIndex, singleOuterEdgeLevels[outerEdgeLevelCaseNdx]);
					const glu::VertexArrayBinding	bindings[]			= { glu::va::Float("in_v_attr", 1, (int)patchTessLevels.size(), 0, &patchTessLevels[0]) };

					log << TestLog::Message << "Testing with outer tessellation level " << singleOuterEdgeLevels[outerEdgeLevelCaseNdx]
											<< " for the " << edgeDesc.description() << " edge, and with various levels for other edges" << TestLog::EndMessage;

					{
						const TFHandler::Result		tfResult		= tfHandler.renderAndGetPrimitives(programGL, outputPrimitiveTypeGL(m_primitiveType, m_usePointMode),
																										DE_LENGTH_OF_ARRAY(bindings), &bindings[0], (int)patchTessLevels.size());
						const int					refNumVertices	= referenceVertexCount(m_primitiveType, m_spacing, m_usePointMode, &patchTessLevels[0], &patchTessLevels[2]);

						if ((int)tfResult.varying.size() != refNumVertices)
						{
							log << TestLog::Message << "Failure: the number of vertices returned by transform feedback is "
													<< tfResult.varying.size() << ", expected " << refNumVertices << TestLog::EndMessage
								<< TestLog::Message << "Note: rendered 1 patch, tessellation levels are (in order [inner0, inner1, outer0, outer1, outer2, outer3]):\n"
													<< containerStr(patchTessLevels, 6) << TestLog::EndMessage;

							m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of vertices");
							return STOP;
						}

						{
							Vec3Set currentEdgeVertices;

							// Get the vertices on the current outer edge.
							for(int vtxNdx = 0; vtxNdx < refNumVertices; vtxNdx++)
							{
								const Vec3& vtx = tfResult.varying[vtxNdx];
								if (edgeDesc.contains(vtx))
								{
									// Swizzle components to match the order of the first edge.
									if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
									{
										currentEdgeVertices.insert(outerEdgeIndex == 0 ? vtx
																	: outerEdgeIndex == 1 ? vtx.swizzle(1, 0, 2)
																	: outerEdgeIndex == 2 ? vtx.swizzle(2, 1, 0)
																	: Vec3(-1.0f));
									}
									else if (m_primitiveType == TESSPRIMITIVETYPE_QUADS)
									{
										currentEdgeVertices.insert(Vec3(outerEdgeIndex == 0 ? vtx.y()
																		: outerEdgeIndex == 1 ? vtx.x()
																		: outerEdgeIndex == 2 ? vtx.y()
																		: outerEdgeIndex == 3 ? vtx.x()
																		: -1.0f,
																		0.0f, 0.0f));
									}
									else
										DE_ASSERT(false);
								}
							}

							if (outerEdgeIndex == 0)
								firstEdgeVertices = currentEdgeVertices;
							else
							{
								// Compare vertices of this edge to those of the first edge.

								if (currentEdgeVertices != firstEdgeVertices)
								{
									const char* const swizzleDesc = m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? (outerEdgeIndex == 1 ? "(y, x, z)"
																													: outerEdgeIndex == 2 ? "(z, y, x)"
																													: DE_NULL)
																	: m_primitiveType == TESSPRIMITIVETYPE_QUADS ? (outerEdgeIndex == 1 ? "(x, 0)"
																												: outerEdgeIndex == 2 ? "(y, 0)"
																												: outerEdgeIndex == 3 ? "(x, 0)"
																												: DE_NULL)
																	: DE_NULL;

									log << TestLog::Message << "Failure: the set of vertices on the " << edgeDesc.description() << " edge"
															<< " doesn't match the set of vertices on the " << edgeDescriptions[0].description() << " edge" << TestLog::EndMessage
										<< TestLog::Message << "Note: set of vertices on " << edgeDesc.description() << " edge, components swizzled like " << swizzleDesc
															<< " to match component order on first edge:\n" << containerStr(currentEdgeVertices, 5)
															<< "\non " << edgeDescriptions[0].description() << " edge:\n" << containerStr(firstEdgeVertices, 5) << TestLog::EndMessage;
									m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of vertices");
									return STOP;
								}
							}
						}
					}
				}
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}